

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

path_type CLI::detail::check_path(char *file)

{
  string_view str;
  bool bVar1;
  file_type fVar2;
  file_status stat;
  error_code ec;
  path *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  _Alloc_hider in_stack_ffffffffffffffb0;
  undefined8 local_28;
  error_code local_20;
  path_type local_4;
  
  std::error_code::error_code((error_code *)in_stack_ffffffffffffffa0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0._M_p,
             in_stack_ffffffffffffffa8);
  str._M_str = in_stack_ffffffffffffffa8;
  str._M_len = (size_t)in_stack_ffffffffffffffa0;
  to_path_abi_cxx11_(str);
  local_28 = ::std::filesystem::status((path *)&stack0xffffffffffffffb0,&local_20);
  std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffffa0);
  bVar1 = ::std::error_code::operator_cast_to_bool((error_code *)&local_20);
  if (bVar1) {
    local_4 = nonexistent;
  }
  else {
    fVar2 = std::filesystem::file_status::type((file_status *)&local_28);
    if ((byte)(fVar2 + regular) < 2) {
      local_4 = nonexistent;
    }
    else if ((fVar2 == regular) || (fVar2 != directory)) {
      local_4 = file;
    }
    else {
      local_4 = directory;
    }
  }
  return local_4;
}

Assistant:

CLI11_INLINE path_type check_path(const char *file) noexcept {
    std::error_code ec;
    auto stat = std::filesystem::status(to_path(file), ec);
    if(ec) {
        return path_type::nonexistent;
    }
    switch(stat.type()) {
    case std::filesystem::file_type::none:  // LCOV_EXCL_LINE
    case std::filesystem::file_type::not_found:
        return path_type::nonexistent;  // LCOV_EXCL_LINE
    case std::filesystem::file_type::directory:
        return path_type::directory;
    case std::filesystem::file_type::symlink:
    case std::filesystem::file_type::block:
    case std::filesystem::file_type::character:
    case std::filesystem::file_type::fifo:
    case std::filesystem::file_type::socket:
    case std::filesystem::file_type::regular:
    case std::filesystem::file_type::unknown:
    default:
        return path_type::file;
    }
}